

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d.cpp
# Opt level: O3

void rw::d3d::destroyVertexBuffer(void *vertexBuffer)

{
  (*DAT_00149850)();
  return;
}

Assistant:

void
destroyVertexBuffer(void *vertexBuffer)
{
#ifdef RW_D3D9
	if(vertexBuffer){
		if(((IUnknown*)vertexBuffer)->Release() != 0)
			printf("vertexBuffer wasn't destroyed\n");
		d3d9Globals.numVertexBuffers--;
	}
#else
	rwFree(vertexBuffer);
#endif
}